

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinternalmimedata.cpp
# Opt level: O3

QStringList * QInternalMimeData::formatsHelper(QStringList *__return_storage_ptr__,QMimeData *data)

{
  char cVar1;
  long lVar2;
  undefined1 *puVar3;
  long in_FS_OFFSET;
  QLatin1String QVar4;
  QStringView QVar5;
  QArrayDataPointer<QString> local_58;
  QArrayDataPointer<QByteArray> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined4 *)&(__return_storage_ptr__->d).d = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = 0xaaaaaaaa;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = 0xaaaaaaaa;
  (**(code **)(*(long *)data + 0x68))();
  QVar4.m_data = "application/x-qt-image";
  QVar4.m_size = 0x16;
  cVar1 = QtPrivate::QStringList_contains
                    ((QList_conflict *)__return_storage_ptr__,QVar4,CaseSensitive);
  if (cVar1 != '\0') {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QImageWriter::supportedImageFormats();
    imageMimeFormats((QStringList *)&local_58,(QList<QByteArray> *)&local_38);
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_38);
    if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
      lVar2 = 0;
      puVar3 = (undefined1 *)0x0;
      do {
        QVar5.m_data = *(storage_type_conflict **)((long)&((local_58.ptr)->d).ptr + lVar2);
        QVar5.m_size = *(qsizetype *)((long)&((local_58.ptr)->d).size + lVar2);
        cVar1 = QtPrivate::QStringList_contains
                          ((QList_conflict *)__return_storage_ptr__,QVar5,CaseSensitive);
        if (cVar1 == '\0') {
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                     (__return_storage_ptr__->d).size,
                     (QString *)((long)&((local_58.ptr)->d).d + lVar2));
          QList<QString>::end(__return_storage_ptr__);
        }
        puVar3 = puVar3 + 1;
        lVar2 = lVar2 + 0x18;
      } while (puVar3 < (ulong)local_58.size);
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QInternalMimeData::formatsHelper(const QMimeData *data)
{
    QStringList realFormats = data->formats();
    if (realFormats.contains("application/x-qt-image"_L1)) {
        // add all supported image formats
        QStringList imageFormats = imageWriteMimeFormats();
        for (int i = 0; i < imageFormats.size(); ++i) {
            if (!realFormats.contains(imageFormats.at(i)))
                realFormats.append(imageFormats.at(i));
        }
    }
    return realFormats;
}